

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::paramCheckFix
          (TParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TType *type)

{
  ulong uVar1;
  TQualifier *pTVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  char *pcVar5;
  TStorageQualifier local_54;
  TString local_50;
  TType *local_28;
  TType *type_local;
  TQualifier *qualifier_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  
  local_28 = type;
  type_local = (TType *)qualifier;
  qualifier_local = (TQualifier *)loc;
  loc_local = (TSourceLoc *)this;
  bVar3 = TQualifier::isMemory(qualifier);
  if (bVar3) {
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var,iVar4) + 8) & 0xfffbffffffffffff | uVar1 & 0x4000000000000
    ;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_00,iVar4) + 8) & 0xfff7ffffffffffff |
         uVar1 & 0x8000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_01,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_01,iVar4) + 8) & 0xfffdffffffffffff |
         uVar1 & 0x2000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_02,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_02,iVar4) + 8) & 0xffefffffffffffff |
         uVar1 & 0x10000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_03,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_03,iVar4) + 8) & 0xffdfffffffffffff |
         uVar1 & 0x20000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_04,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_04,iVar4) + 8) & 0xffbfffffffffffff |
         uVar1 & 0x40000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_05,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_05,iVar4) + 8) & 0xff7fffffffffffff |
         uVar1 & 0x80000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_06,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_06,iVar4) + 8) & 0xfeffffffffffffff |
         uVar1 & 0x100000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_07,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_07,iVar4) + 8) & 0xfdffffffffffffff |
         uVar1 & 0x200000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_08,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_08,iVar4) + 8) & 0xffff7fffffffffff |
         uVar1 & 0x800000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_09,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_09,iVar4) + 8) & 0xfffeffffffffffff |
         uVar1 & 0x1000000000000;
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_10,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_10,iVar4) + 8) & 0xffffbfffffffffff |
         (ulong)((byte)(uVar1 >> 0x2e) & 1) << 0x2e;
  }
  bVar3 = TQualifier::isAuxiliary((TQualifier *)type_local);
  if ((bVar3) || (bVar3 = TQualifier::isInterpolation((TQualifier *)type_local), bVar3)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,qualifier_local,
               "cannot use auxiliary or interpolation qualifiers on a function parameter","");
  }
  bVar3 = TQualifier::hasLayout((TQualifier *)type_local);
  if (bVar3) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,qualifier_local,"cannot use layout qualifiers on a function parameter","");
  }
  if ((*(ulong *)&type_local->field_0x8 >> 0x1c & 1) != 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,qualifier_local,"cannot use invariant qualifier on a function parameter","");
  }
  bVar3 = TQualifier::isNoContraction((TQualifier *)type_local);
  if (bVar3) {
    bVar3 = TQualifier::isParamOutput((TQualifier *)type_local);
    if (bVar3) {
      iVar4 = (*local_28->_vptr_TType[10])();
      TQualifier::setNoContraction((TQualifier *)CONCAT44(extraout_var_11,iVar4));
    }
    else {
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
                (this,qualifier_local,"qualifier has no effect on non-output parameters","precise",
                 "");
    }
  }
  bVar3 = TQualifier::isNonUniform((TQualifier *)type_local);
  if (bVar3) {
    uVar1 = *(ulong *)&type_local->field_0x8;
    iVar4 = (*local_28->_vptr_TType[10])();
    *(ulong *)(CONCAT44(extraout_var_12,iVar4) + 8) =
         *(ulong *)(CONCAT44(extraout_var_12,iVar4) + 8) & 0xfffffffdffffffff |
         (ulong)((byte)(uVar1 >> 0x21) & 1) << 0x21;
  }
  bVar3 = TQualifier::isSpirvByReference((TQualifier *)type_local);
  if (bVar3) {
    iVar4 = (*local_28->_vptr_TType[10])();
    TQualifier::setSpirvByReference((TQualifier *)CONCAT44(extraout_var_13,iVar4));
  }
  bVar3 = TQualifier::isSpirvLiteral((TQualifier *)type_local);
  if (bVar3) {
    iVar4 = (*local_28->_vptr_TType[7])();
    if ((((iVar4 == 1) || (iVar4 = (*local_28->_vptr_TType[7])(), iVar4 == 8)) ||
        (iVar4 = (*local_28->_vptr_TType[7])(), iVar4 == 9)) ||
       (iVar4 = (*local_28->_vptr_TType[7])(), pTVar2 = qualifier_local, iVar4 == 0xc)) {
      iVar4 = (*local_28->_vptr_TType[10])();
      TQualifier::setSpirvLiteral((TQualifier *)CONCAT44(extraout_var_14,iVar4));
    }
    else {
      TType::getBasicTypeString_abi_cxx11_(&local_50,local_28);
      pcVar5 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (&local_50);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar2,"cannot use spirv_literal qualifier",pcVar5,"");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      ~basic_string(&local_50);
    }
  }
  local_54 = (TStorageQualifier)*(undefined8 *)&type_local->field_0x8 & 0x7f;
  paramCheckFixStorage(this,(TSourceLoc *)qualifier_local,&local_54,local_28);
  return;
}

Assistant:

void TParseContext::paramCheckFix(const TSourceLoc& loc, const TQualifier& qualifier, TType& type)
{
    if (qualifier.isMemory()) {
        type.getQualifier().volatil   = qualifier.volatil;
        type.getQualifier().nontemporal   = qualifier.nontemporal;
        type.getQualifier().coherent  = qualifier.coherent;
        type.getQualifier().devicecoherent  = qualifier.devicecoherent ;
        type.getQualifier().queuefamilycoherent  = qualifier.queuefamilycoherent;
        type.getQualifier().workgroupcoherent  = qualifier.workgroupcoherent;
        type.getQualifier().subgroupcoherent  = qualifier.subgroupcoherent;
        type.getQualifier().shadercallcoherent = qualifier.shadercallcoherent;
        type.getQualifier().nonprivate = qualifier.nonprivate;
        type.getQualifier().readonly  = qualifier.readonly;
        type.getQualifier().writeonly = qualifier.writeonly;
        type.getQualifier().restrict  = qualifier.restrict;
    }

    if (qualifier.isAuxiliary() ||
        qualifier.isInterpolation())
        error(loc, "cannot use auxiliary or interpolation qualifiers on a function parameter", "", "");
    if (qualifier.hasLayout())
        error(loc, "cannot use layout qualifiers on a function parameter", "", "");
    if (qualifier.invariant)
        error(loc, "cannot use invariant qualifier on a function parameter", "", "");
    if (qualifier.isNoContraction()) {
        if (qualifier.isParamOutput())
            type.getQualifier().setNoContraction();
        else
            warn(loc, "qualifier has no effect on non-output parameters", "precise", "");
    }
    if (qualifier.isNonUniform())
        type.getQualifier().nonUniform = qualifier.nonUniform;
    if (qualifier.isSpirvByReference())
        type.getQualifier().setSpirvByReference();
    if (qualifier.isSpirvLiteral()) {
        if (type.getBasicType() == EbtFloat || type.getBasicType() == EbtInt || type.getBasicType() == EbtUint ||
            type.getBasicType() == EbtBool)
            type.getQualifier().setSpirvLiteral();
        else
            error(loc, "cannot use spirv_literal qualifier", type.getBasicTypeString().c_str(), "");
    }

    paramCheckFixStorage(loc, qualifier.storage, type);
}